

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2::SharedDtor
               (MessageLite *self)

{
  TestAllTypesLite *this;
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestAllTypesLite *)self[1]._internal_metadata_.ptr_;
    if (this != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(this);
    }
    operator_delete(this,0x348);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x1c90,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void TestParsingMergeLite_RepeatedFieldsGenerator_Group2::SharedDtor(MessageLite& self) {
  TestParsingMergeLite_RepeatedFieldsGenerator_Group2& this_ = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator_Group2&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.field1_;
  this_._impl_.~Impl_();
}